

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

double __thiscall despot::TagManhattanUpperBound::Value(TagManhattanUpperBound *this,Belief *belief)

{
  double dVar1;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *this_00;
  size_type sVar2;
  const_reference ppSVar3;
  const_reference pvVar4;
  TagState *state;
  State *particle;
  double dStack_28;
  int i;
  double value;
  vector<despot::State_*,_std::allocator<despot::State_*>_> *particles;
  Belief *belief_local;
  TagManhattanUpperBound *this_local;
  
  this_00 = (vector<despot::State_*,_std::allocator<despot::State_*>_> *)
            (**(code **)(*(long *)belief + 0x30))();
  dStack_28 = 0.0;
  particle._4_4_ = 0;
  while( true ) {
    sVar2 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::size(this_00);
    if (sVar2 <= (ulong)(long)particle._4_4_) break;
    ppSVar3 = std::vector<despot::State_*,_std::allocator<despot::State_*>_>::operator[]
                        (this_00,(long)particle._4_4_);
    dVar1 = *(double *)(*ppSVar3 + 0x18);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       (&this->value_,(long)*(int *)(*ppSVar3 + 0xc));
    dStack_28 = dVar1 * *pvVar4 + dStack_28;
    particle._4_4_ = particle._4_4_ + 1;
  }
  return dStack_28;
}

Assistant:

double Value(const Belief* belief) const {
		const vector<State*>& particles =
			static_cast<const ParticleBelief*>(belief)->particles();

		double value = 0;
		for (int i = 0; i < particles.size(); i++) {
			State* particle = particles[i];
			const TagState* state = static_cast<const TagState*>(particle);
			value += state->weight * value_[state->state_id];
		}
		return value;
	}